

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::StreamingConcatenationExpression::evalImpl
          (ConstantValue *__return_storage_ptr__,StreamingConcatenationExpression *this,
          EvalContext *context)

{
  bool bVar1;
  size_type __n;
  iterator pSVar2;
  Expression *pEVar3;
  ConstantRange *pCVar4;
  Type *pTVar5;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  sVar6;
  optional<slang::ConstantRange> oVar7;
  ConstantValue local_150;
  ConstantValue local_128;
  ConstantRange local_100;
  ConstantValue local_f8;
  _Storage<slang::ConstantRange,_true> local_d0;
  int32_t local_c8;
  _Storage<slang::ConstantRange,_true> local_c0;
  optional<slang::ConstantRange> range;
  ConstantValue cv;
  StreamExpression *stream;
  iterator __end2;
  iterator __begin2;
  size_type local_68;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *local_60;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  *__range2;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  local_48;
  undefined1 local_38 [8];
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> values;
  EvalContext *context_local;
  StreamingConcatenationExpression *this_local;
  
  values.super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)context;
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::vector
            ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_38);
  local_48 = streams(this);
  __n = nonstd::span_lite::
        span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
        ::size(&local_48);
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::reserve
            ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_38,__n);
  sVar6 = streams(this);
  local_68 = sVar6.size_;
  __begin2 = sVar6.data_;
  local_60 = (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
              *)&__begin2;
  __end2 = nonstd::span_lite::
           span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
           ::begin(local_60);
  pSVar2 = nonstd::span_lite::
           span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
           ::end(local_60);
  for (; __end2 != pSVar2; __end2 = __end2 + 1) {
    pEVar3 = not_null<const_slang::ast::Expression_*>::operator->(&__end2->operand);
    Expression::eval((ConstantValue *)
                     &range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                      super__Optional_payload_base<slang::ConstantRange>._M_engaged,pEVar3,
                     (EvalContext *)
                     values.
                     super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = slang::ConstantValue::operator_cast_to_bool
                      ((ConstantValue *)
                       &range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                        super__Optional_payload_base<slang::ConstantRange>._M_engaged);
    if (bVar1) {
      if (__end2->withExpr != (Expression *)0x0) {
        oVar7 = Expression::evalSelector
                          (__end2->withExpr,
                           (EvalContext *)
                           values.
                           super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_d0 = oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::ConstantRange>._M_payload;
        local_c8 = CONCAT31(local_c8._1_3_,
                            oVar7.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                            super__Optional_payload_base<slang::ConstantRange>._M_engaged);
        range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.left = local_c8;
        local_c0 = local_d0;
        bVar1 = std::optional::operator_cast_to_bool((optional *)&local_c0._M_value);
        if (!bVar1) {
          slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
          range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.right = 1;
          goto LAB_00692d75;
        }
        pCVar4 = std::optional<slang::ConstantRange>::operator*
                           ((optional<slang::ConstantRange> *)&local_c0._M_value);
        local_100 = *pCVar4;
        pEVar3 = not_null<const_slang::ast::Expression_*>::operator->(&__end2->operand);
        pTVar5 = not_null<const_slang::ast::Type_*>::operator->(&pEVar3->type);
        pTVar5 = Type::getArrayElementType(pTVar5);
        Type::getDefaultValue(&local_128,pTVar5);
        Bitstream::resizeToRange
                  (&local_f8,
                   (ConstantValue *)
                   &range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_engaged,local_100,
                   &local_128,false);
        slang::ConstantValue::operator=
                  ((ConstantValue *)
                   &range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_engaged,&local_f8);
        slang::ConstantValue::~ConstantValue(&local_f8);
        slang::ConstantValue::~ConstantValue(&local_128);
      }
      std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
      emplace_back<slang::ConstantValue>
                ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_38,
                 (ConstantValue *)
                 &range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_engaged);
      range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.right = 0;
    }
    else {
      slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
      range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.right = 1;
    }
LAB_00692d75:
    slang::ConstantValue::~ConstantValue
              ((ConstantValue *)
               &range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_engaged);
    if (range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.right != 0)
    goto LAB_00692e47;
  }
  if (this->sliceSize == 0) {
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,(Elements *)local_38);
    range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.right = 1;
  }
  else {
    slang::ConstantValue::ConstantValue(&local_150,(Elements *)local_38);
    Bitstream::reOrder(__return_storage_ptr__,&local_150,this->sliceSize,0);
    slang::ConstantValue::~ConstantValue(&local_150);
    range.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ConstantRange>._M_payload._M_value.right = 1;
  }
LAB_00692e47:
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
            ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue StreamingConcatenationExpression::evalImpl(EvalContext& context) const {
    std::vector<ConstantValue> values;
    values.reserve(streams().size());
    for (auto& stream : streams()) {
        auto cv = stream.operand->eval(context);
        if (!cv)
            return nullptr;

        if (stream.withExpr) {
            auto range = stream.withExpr->evalSelector(context);
            if (!range)
                return nullptr;

            // If the range expression evaluates to a range greater than the extent of the array
            // size, the entire array is streamed, and the remaining items are generated using the
            // nonexistent array entry value
            cv = Bitstream::resizeToRange(
                std::move(cv), *range,
                stream.operand->type->getArrayElementType()->getDefaultValue());
        }

        values.emplace_back(std::move(cv));
    }

    if (sliceSize > 0)
        return Bitstream::reOrder(std::move(values), sliceSize);

    return values;
}